

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *entry_point,uint32_t scalar_var_id)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  IRContext *this_01;
  pointer pOVar1;
  uint **ppuVar2;
  InterfaceVariableScalarReplacement *pIVar3;
  bool bVar4;
  char cVar5;
  iterator iVar6;
  long *plVar7;
  uint **ppuVar8;
  PodType (*paPVar9) [2];
  pointer pOVar10;
  Instruction *pIVar11;
  __hashtable *__h;
  uint32_t interface_var_id;
  string message;
  undefined1 local_c8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a8;
  Instruction *local_a0;
  uint32_t local_98;
  uint32_t local_94;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  code *local_80;
  PodType local_78 [2];
  uint *local_70;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  DefUseManager *local_60;
  InterfaceVariableScalarReplacement *local_58;
  string local_50;
  
  this_01 = (this->super_Pass).context_;
  local_a0 = entry_point;
  local_94 = scalar_var_id;
  if ((this_01->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_01);
  }
  local_60 = (this_01->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_98 = 0;
  if (interface_var->has_result_id_ == true) {
    local_98 = Instruction::GetSingleWordOperand(interface_var,(uint)interface_var->has_type_id_);
  }
  this_00 = &this->interface_vars_removed_from_entry_point_operands_;
  iVar6 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,&local_98);
  pIVar11 = local_a0;
  if (iVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_88 = (undefined1  [8])&local_94;
    local_78 = (PodType  [2])
               std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
               ::_M_invoke;
    local_80 = std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
               ::_M_manager;
    pOVar10 = (local_a0->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar1 = (local_a0->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_90 = (undefined1  [8])&local_98;
    local_58 = this;
    if (pOVar10 == pOVar1) {
      std::
      _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
      ::_M_manager((_Any_data *)local_90,(_Any_data *)local_90,__destroy_functor);
    }
    else {
      do {
        bVar4 = spvIsInIdType(pOVar10->type);
        if (bVar4) {
          ppuVar2 = (uint **)(pOVar10->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar8 = &(pOVar10->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar8 = ppuVar2;
          }
          local_c8._0_8_ = *ppuVar8;
          if (local_80 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar5 = (*(code *)local_78)(local_90,local_c8);
          if (cVar5 == '\0') {
            bVar4 = false;
            goto LAB_0022c911;
          }
        }
        pOVar10 = pOVar10 + 1;
      } while (pOVar10 != pOVar1);
      bVar4 = true;
LAB_0022c911:
      pIVar11 = local_a0;
      if (local_80 != (code *)0x0) {
        (*local_80)(local_90,local_90,3);
      }
      if (!bVar4) {
        analysis::DefUseManager::AnalyzeInstUse(local_60,pIVar11);
        local_90 = (undefined1  [8])this_00;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,&local_98);
        goto LAB_0022c866;
      }
    }
    local_90 = (undefined1  [8])(local_88 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"interface variable is not an operand of the entry point","");
    Instruction::PrettyPrint_abi_cxx11_(&local_50,interface_var,0x40);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3345f1);
    paPVar9 = (PodType (*) [2])(plVar7 + 2);
    if ((PodType (*) [2])*plVar7 == paPVar9) {
      local_c8._16_8_ = *paPVar9;
      local_c8._24_8_ = plVar7[3];
      local_c8._0_8_ = (PodType (*) [2])(local_c8 + 0x10);
    }
    else {
      local_c8._16_8_ = *paPVar9;
      local_c8._0_8_ = (PodType (*) [2])*plVar7;
    }
    local_c8._8_8_ = plVar7[1];
    *plVar7 = (long)paPVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append(local_90,local_c8._0_8_);
    if ((PodType (*) [2])local_c8._0_8_ != (PodType (*) [2])(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Instruction::PrettyPrint_abi_cxx11_(&local_50,pIVar11,0x40);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3345f1);
    paPVar9 = (PodType (*) [2])(plVar7 + 2);
    if ((PodType (*) [2])*plVar7 == paPVar9) {
      local_c8._16_8_ = *paPVar9;
      local_c8._24_8_ = plVar7[3];
      local_c8._0_8_ = (PodType (*) [2])(local_c8 + 0x10);
    }
    else {
      local_c8._16_8_ = *paPVar9;
      local_c8._0_8_ = (PodType (*) [2])*plVar7;
    }
    local_c8._8_8_ = plVar7[1];
    *plVar7 = (long)paPVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append(local_90,local_c8._0_8_);
    if ((PodType (*) [2])local_c8._0_8_ != (PodType (*) [2])(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    pIVar3 = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_c8._0_8_ = (_func_int **)0x0;
    local_c8._8_8_ = 0;
    local_c8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_c8._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&((pIVar3->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",
               (spv_position_t *)local_c8,(char *)local_90);
    if (local_90 != (undefined1  [8])(local_88 + 8)) {
      operator_delete((void *)local_90,(ulong)(local_80 + 1));
    }
    bVar4 = false;
  }
  else {
    local_c8._24_8_ = local_c8 + 0x10;
    local_c8._0_8_ = &PTR__SmallVector_003d7c78;
    local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8._16_4_ = scalar_var_id;
    local_c8._8_8_ = 1;
    local_90._0_4_ = SPV_OPERAND_TYPE_ID;
    local_88 = (undefined1  [8])&PTR__SmallVector_003d7c78;
    local_80 = (code *)0x0;
    local_70 = (uint *)(local_88 + 0x10);
    local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_88,(SmallVector<unsigned_int,_2UL> *)local_c8
              );
    pIVar11 = local_a0;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&local_a0->operands_,(Operand *)local_90);
    local_88 = (undefined1  [8])&PTR__SmallVector_003d7c78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_68,local_68._M_head_impl);
    }
    local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_a8,local_a8._M_head_impl);
    }
    analysis::DefUseManager::AnalyzeInstUse(local_60,pIVar11);
LAB_0022c866:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint(
    Instruction* interface_var, Instruction* entry_point,
    uint32_t scalar_var_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t interface_var_id = interface_var->result_id();
  if (interface_vars_removed_from_entry_point_operands_.find(
          interface_var_id) !=
      interface_vars_removed_from_entry_point_operands_.end()) {
    entry_point->AddOperand({SPV_OPERAND_TYPE_ID, {scalar_var_id}});
    def_use_mgr->AnalyzeInstUse(entry_point);
    return true;
  }

  bool success = !entry_point->WhileEachInId(
      [&interface_var_id, &scalar_var_id](uint32_t* id) {
        if (*id == interface_var_id) {
          *id = scalar_var_id;
          return false;
        }
        return true;
      });
  if (!success) {
    std::string message(
        "interface variable is not an operand of the entry point");
    message += "\n  " + interface_var->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    message += "\n  " + entry_point->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    return false;
  }

  def_use_mgr->AnalyzeInstUse(entry_point);
  interface_vars_removed_from_entry_point_operands_.insert(interface_var_id);
  return true;
}